

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O3

int32_t icu_63::anon_unknown_7::getReorderCode(char *s)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0x1000;
  lVar3 = 0;
  do {
    iVar1 = uprv_stricmp_63(s,(char *)((long)&_ZN6icu_6312_GLOBAL__N_116collReorderCodesE_rel +
                                      (long)*(int *)((long)&
                                                  _ZN6icu_6312_GLOBAL__N_116collReorderCodesE_rel +
                                                  lVar3)));
    if (iVar1 == 0) {
      return iVar2;
    }
    lVar3 = lVar3 + 4;
    iVar2 = iVar2 + 1;
  } while (lVar3 != 0x14);
  return -1;
}

Assistant:

int32_t getReorderCode(const char *s) {
    for (int32_t i = 0; i < UPRV_LENGTHOF(collReorderCodes); ++i) {
        if (uprv_stricmp(s, collReorderCodes[i]) == 0) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    // Not supporting "others" = UCOL_REORDER_CODE_OTHERS
    // as a synonym for Zzzz = USCRIPT_UNKNOWN for now:
    // Avoid introducing synonyms/aliases.
    return -1;
}